

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O3

int verify_fits(char *infile,FILE *out)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  char *pcVar6;
  int hdunum;
  FILE *infits_00;
  char cVar7;
  char *__s;
  int hdutype;
  fitsfile *infits;
  char xtension [80];
  FitsHdu fitshdu;
  char rootnam [1025];
  int local_558;
  int local_554;
  fitsfile *local_550;
  long local_548;
  char local_540;
  FitsHdu local_4f0;
  char local_438 [1032];
  
  memset(local_438,0,0x401);
  local_558 = 0;
  ppuVar4 = __ctype_b_loc();
  __s = infile + -1;
  do {
    cVar7 = __s[1];
    __s = __s + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)cVar7 * 2 + 1) & 0x20) != 0);
  sVar5 = strlen(__s);
  if (0 < (int)sVar5) {
    pcVar6 = __s + ((int)sVar5 - 1);
    do {
      if ((*(byte *)((long)*ppuVar4 + (long)*pcVar6 * 2 + 1) & 0x20) == 0) break;
      *pcVar6 = '\0';
      pcVar6 = pcVar6 + -1;
      iVar2 = (int)sVar5;
      uVar1 = iVar2 - 1;
      sVar5 = (size_t)uVar1;
    } while (uVar1 != 0 && 0 < iVar2);
    cVar7 = *__s;
  }
  if (cVar7 != '\0') {
    wrtout(out," ");
    sprintf(comm,"File: %s",__s);
    wrtout(out,comm);
    totalhdu = 0;
    iVar2 = ffdkopn(&local_550,__s,0,&local_558);
    if ((iVar2 == 0) && (iVar2 = ffthdu(local_550,&totalhdu,&local_558), iVar2 == 0)) {
      init_report(out,local_438);
      if (0 < totalhdu) {
        iVar2 = 0;
        do {
          hdunum = iVar2 + 1;
          local_554 = -1;
          iVar3 = ffmahd(local_550,hdunum,&local_554,&local_558);
          if (iVar3 != 0) {
            print_title(out,hdunum,local_554);
            wrtferr(out,"",&local_558,2);
            set_hdubasic(hdunum,local_554);
            break;
          }
          iVar3 = local_554;
          if (local_554 == 0 && iVar2 != 0) {
            ffgky(local_550,0x10,"XTENSION",&local_548,0,&local_558);
            iVar3 = 2;
            if (local_540 != '\0' || local_548 != 0x454c4241544e4942) {
              iVar3 = local_554;
            }
          }
          print_title(out,hdunum,iVar3);
          init_hdu(local_550,out,hdunum,local_554,&local_4f0);
          test_hdu(local_550,out,&local_4f0);
          if (testdata != 0) {
            test_data(local_550,out,&local_4f0);
          }
          infits_00 = out;
          close_err(out);
          if (prhead != 0) {
            infits_00 = out;
            print_header(out);
          }
          if (prstat != 0) {
            print_summary((fitsfile *)infits_00,out,&local_4f0);
          }
          close_hdu(&local_4f0);
          iVar2 = hdunum;
        } while (hdunum < totalhdu);
      }
      test_end(local_550,out);
      close_report(out);
      ffclos(local_550,&local_558);
    }
    else {
      wrtserr(out,"",&local_558,2);
      builtin_strncpy(comm,"**** Abort Verification: Fatal Error. ****",0x2b);
      wrtout(out,comm);
      update_parfile(1,0);
      local_558 = 1;
    }
  }
  return local_558;
}

Assistant:

int verify_fits(char *infile, FILE *out)
{
    char rootnam[FLEN_FILENAME] = "";   /* Input Fits file root name */
    fitsfile *infits;                   /* input fits file pointer */
    FitsHdu fitshdu;                    /* hdu information */
    int hdutype;
    int status = 0;
    int i;
    int len;
    char *p;
    char *pfile;
    char xtension[80];

    /* take out the leading and trailing space and skip the empty line*/
    p = infile;
    while(isspace((int)*p) )p++;
    len = strlen(p);
    pfile = p;
    p += (len -1);
    for (i = len - 1; i >= 0 && isspace((int)*p); i--) {*p = '\0'; p--;}
    if(!strlen(pfile)) return status;

#ifndef WEBTOOL
    wrtout(out," ");
    sprintf(comm,"File: %s",pfile);
    wrtout(out,comm);
#endif

    totalhdu = 0;

#ifndef STANDALONE
    /* discard the extension, rowfilter... */
    if(ffrtnm(pfile, rootnam, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }

    if(fits_open_file(&infits, rootnam, READONLY, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }
#else
    if(fits_open_diskfile(&infits, pfile, READONLY, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }
#endif

    /* get the total hdus */
    if(fits_get_num_hdus(infits, &totalhdu, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }

    /* initialize the report */
    init_report(out,rootnam);
    /*------------------  Hdu Loop --------------------------------*/
    for (i = 1; i <= totalhdu; i++) {
        /* move to the right hdu and do the CFITSIO test */
        hdutype = -1;
        if(fits_movabs_hdu(infits,i, &hdutype, &status) ) {
            print_title(out,i, hdutype);
            wrtferr(out,"",&status,2);
            set_hdubasic(i,hdutype);
            break;
        }

        if (i != 1 && hdutype == IMAGE_HDU) {
           /* test if this is a tile compressed image in a binary table */
           fits_read_key(infits, TSTRING, "XTENSION", xtension, NULL, &status);
           if (!strcmp(xtension, "BINTABLE") )
               print_title(out,i, BINARY_TBL);
	   else
	       print_title(out,i, hdutype);
        }  
        else
               print_title(out,i, hdutype);

        init_hdu(infits,out,i,hdutype,
            &fitshdu);                          /* initialize fitshdu  */

        test_hdu(infits,out,&fitshdu);          /* test hdu header */

        if(testdata)
            test_data(infits,out,&fitshdu);

        close_err(out);                         /* end of error report */

        if(prhead)
            print_header(out);
        if(prstat)
            print_summary(infits,out,&fitshdu);
        close_hdu(&fitshdu);                    /* clear the fitshdu  */
    }
    /* test the end of file  */
    test_end(infits,out);

    /*------------------ Closing  --------------------------------*/
    /* closing the report*/
    close_report(out);

    /* close the input fitsfile  */
    fits_close_file(infits, &status);

    return status;
}